

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O1

void * Mf_ManGenerateCnf(Gia_Man_t *pGia,int nLutSize,int fCnfObjIds,int fAddOrCla,int fMapping,
                        int fVerbose)

{
  Gia_Man_t *pNew;
  Jf_Par_t Pars;
  Gia_Man_t *local_140;
  Jf_Par_t local_138;
  
  if (nLutSize - 3U < 6) {
    memset(&local_138,0,0x108);
    local_138.nProcNum = 0;
    local_138.nRounds = 2;
    local_138.nRoundsEla = 1;
    local_138.nRelaxRatio = 0;
    local_138.nCoarseLimit = 3;
    local_138.nAreaTuner = 1;
    local_138.nVerbLimit = 5;
    local_138.DelayTarget = -1;
    local_138.fAreaOnly = 0;
    local_138.fOptEdge = 1;
    local_138.fCutMin = 0;
    local_138.fPureAig = 0;
    local_138.fVeryVerbose = 0;
    local_138.nLutSizeMax = 10;
    local_138.nCutNumMax = 0x10;
    local_138.fGenCnf = 1;
    local_138.fCoarsen = (int)(fCnfObjIds == 0);
    local_138.nCutNum = 8;
    local_138.nLutSize = nLutSize;
    local_138.fCnfObjIds = fCnfObjIds;
    local_138.fAddOrCla = fAddOrCla;
    local_138.fCnfMapping = fMapping;
    local_138.fVerbose = fVerbose;
    local_140 = Mf_ManPerformMapping(pGia,&local_138);
    Gia_ManStopP(&local_140);
    return pGia->pData;
  }
  __assert_fail("nLutSize >= 3 && nLutSize <= 8",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMf.c"
                ,0x6b1,"void *Mf_ManGenerateCnf(Gia_Man_t *, int, int, int, int, int)");
}

Assistant:

void * Mf_ManGenerateCnf( Gia_Man_t * pGia, int nLutSize, int fCnfObjIds, int fAddOrCla, int fMapping, int fVerbose )
{
    Gia_Man_t * pNew;
    Jf_Par_t Pars, * pPars = &Pars;
    assert( nLutSize >= 3 && nLutSize <= 8 );
    Mf_ManSetDefaultPars( pPars );
    pPars->fGenCnf     = 1;
    pPars->fCoarsen    = !fCnfObjIds;
    pPars->nLutSize    = nLutSize;
    pPars->fCnfObjIds  = fCnfObjIds;
    pPars->fAddOrCla   = fAddOrCla;
    pPars->fCnfMapping = fMapping;
    pPars->fVerbose    = fVerbose;
    pNew = Mf_ManPerformMapping( pGia, pPars );
    Gia_ManStopP( &pNew );
//    Cnf_DataPrint( (Cnf_Dat_t *)pGia->pData, 1 );
    return pGia->pData;
}